

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckFeatures.cpp
# Opt level: O1

bool __thiscall GrcManager::PreCompileLanguages(GrcManager *this,GrcFont *param_1)

{
  pointer ppGVar1;
  ulong uVar2;
  
  ppGVar1 = (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar1) {
    uVar2 = 0;
    do {
      GdlLangClass::PreCompile(ppGVar1[uVar2],this);
      uVar2 = uVar2 + 1;
      ppGVar1 = (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->m_vplcls).
                                   super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3))
    ;
  }
  GdlRenderer::CheckLanguageFeatureSize(this->m_prndr);
  return true;
}

Assistant:

bool GrcManager::PreCompileLanguages(GrcFont * /*pfont*/)
{
	for (size_t ilcls = 0; ilcls < m_vplcls.size(); ilcls++)
		m_vplcls[ilcls]->PreCompile(this);

	m_prndr->CheckLanguageFeatureSize();

	return true;
}